

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSlowShrinking.cpp
# Opt level: O0

int main(void)

{
  size_t in_stack_000015c0;
  size_t in_stack_000015c8;
  size_t in_stack_000015d0;
  ostream *in_stack_000015d8;
  Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  *in_stack_000015e0;
  duration<double,_std::ratio<1L,_1L>_> in_stack_000015e8;
  SeedType in_stack_00001600;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff78;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff80;
  
  PropTestSlowFunction::PropTestSlowFunction((PropTestSlowFunction *)0x0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1l>,void>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  cppqc::
  quickCheckOutput<std::vector<int,std::allocator<int>>,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
            (in_stack_000015e0,in_stack_000015d8,in_stack_000015d0,in_stack_000015c8,
             in_stack_000015c0,in_stack_000015e8,in_stack_00001600);
  cppqc::Result::~Result((Result *)0x11d553);
  PropTestSlowFunction::~PropTestSlowFunction((PropTestSlowFunction *)0x11d55d);
  return 0;
}

Assistant:

int main() {
  cppqc::quickCheckOutput(PropTestSlowFunction());
}